

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O0

string * generateCopyrightMessage(string *__return_storage_ptr__,string *comment)

{
  string local_90;
  string local_70;
  size_type local_40;
  size_t pos;
  string copyrightMessage;
  string *comment_local;
  
  copyrightMessage.field_2._8_8_ = comment;
  std::__cxx11::string::string((string *)&pos,comment);
  for (local_40 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos,
                       '\n',0); local_40 != 0xffffffffffffffff;
      local_40 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos,'\n'
                      ,local_40 + 1)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos,local_40,1,
               "\n// ");
  }
  trimEnd(&local_70,(string *)&pos);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos,
             "\n\n// This header is generated from the Khronos Vulkan XML API Registry.");
  trim(&local_90,(string *)&pos);
  std::operator+(__return_storage_ptr__,&local_90,"\n");
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&pos);
  return __return_storage_ptr__;
}

Assistant:

inline std::string generateCopyrightMessage( std::string const & comment )
{
  std::string copyrightMessage = comment;

  // replace any '\n' with "\n// "
  for ( size_t pos = copyrightMessage.find( '\n' ); pos != std::string::npos; pos = copyrightMessage.find( '\n', pos + 1 ) )
  {
    copyrightMessage.replace( pos, 1, "\n// " );
  }
  // remove any trailing spaces
  copyrightMessage = trimEnd( copyrightMessage );

  // and add a little message on our own
  copyrightMessage += "\n\n// This header is generated from the Khronos Vulkan XML API Registry.";
  return trim( copyrightMessage ) + "\n";
}